

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
               (MPI_Datatype *dt,int *k,
               function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *value)

{
  MPI_Datatype poVar1;
  int iVar2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *this;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  void *unaff_R12;
  _Base_ptr p_Var8;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                             attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::
                             mut()::m);
  if (iVar2 == 0) {
    pmVar3 = keymap();
    p_Var7 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = p_Var8;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        if (*k <= (int)p_Var7[1]._M_color) {
          p_Var4 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < *k];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    if ((p_Var4 != p_Var8) && ((int)p_Var4[1]._M_color <= *k)) {
      p_Var8 = p_Var4;
    }
    pmVar3 = keymap();
    if ((_Rb_tree_header *)p_Var8 == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
      pmVar3 = keymap();
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pmVar3,k);
      *pmVar5 = 0;
      pmVar3 = keymap();
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pmVar3,k);
      MPI_Type_create_keyval(copy_attr,del_attr,pmVar5,0);
    }
    this = (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)operator_new(0x20);
    std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function(this,value);
    poVar1 = *dt;
    pmVar3 = keymap();
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](pmVar3,k);
    MPI_Type_set_attr(poVar1,*pmVar5,this);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::mut()::m);
    return;
  }
  uVar6 = std::__throw_system_error(iVar2);
  operator_delete(unaff_R12,0x20);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::mut()::m);
  _Unwind_Resume(uVar6);
}

Assistant:

static void set(const MPI_Datatype& dt, const K& k, const T& value) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            // create new keyval with MPI
            keymap()[k] = 0;
            MPI_Type_create_keyval(&attr_map<K,T>::copy_attr,
                                   &attr_map<K,T>::del_attr,
                                   &(keymap()[k]), (void*)NULL);
        }
        // insert new key into keymap
        // set the keyval pair
        T* val = new T(value); // copy construct
        MPI_Type_set_attr(dt, keymap()[k], (void*)val);
    }